

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String * __thiscall Bstrlib::String::operator+=(String *this,float c)

{
  String *pSVar1;
  String local_28;
  float local_14;
  String *pSStack_10;
  float c_local;
  String *this_local;
  
  local_14 = c;
  pSStack_10 = this;
  Print((char *)&local_28,(double)c,"%lg");
  pSVar1 = operator+=(this,&local_28);
  ~String(&local_28);
  return pSVar1;
}

Assistant:

const String& String::operator +=(const float c)
    {
#ifndef HasFloatParsing
        char buffer[15] = { 0 };
        ftoa(c, buffer, 6);
        return *this += buffer;
#else
        return *this += String::Print("%lg", c);
#endif
    }